

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::WindGroup> *
metaf::WindGroup::parse
          (optional<metaf::WindGroup> *__return_storage_ptr__,string *group,ReportPart reportPart,
          ReportMetadata *reportMetadata)

{
  Direction DVar1;
  Direction DVar2;
  _Optional_payload<metaf::WindGroup,_true,_true,_true> *p_Var3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  optional<metaf::Speed::Unit> oVar7;
  difference_type dVar8;
  ulong uVar9;
  Type TVar10;
  long lVar11;
  optional<metaf::WindGroup> *poVar12;
  optional<metaf::WindGroup> *poVar13;
  Unit UVar14;
  ulong uVar15;
  ulong uVar16;
  byte bVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  optional<metaf::Direction> oVar20;
  optional<metaf::Speed> oVar21;
  optional<metaf::Speed> oVar22;
  string_type sStack_118;
  undefined8 local_f8;
  uint local_f0;
  undefined4 uStack_ec;
  undefined3 uStack_e8;
  undefined4 uStack_e5;
  uint uStack_e1;
  Type TStack_dd;
  optional<metaf::WindGroup> result;
  optional<metaf::Distance> wsHeight;
  
  bVar17 = 0;
  if (reportPart == RMK) {
    bVar5 = std::operator==(group,"WSHFT");
    if (!bVar5) {
      bVar5 = std::operator==(group,"PK");
      if (bVar5) {
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload = 8;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType =
             NOT_REPORTED;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x10) = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit = KNOTS;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x1c) = 0;
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) = 0;
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                          super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2d) =
             (ulong)(uint3)result.super__Optional_base<metaf::WindGroup,_true,_true>._M_payload.
                           super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
                           windType._0_3_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
                 vsecBegin.dirDegrees + 1) = 0;
        p_Var3 = &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                  _M_payload;
        *(uint *)((long)&(p_Var3->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x3c)
             = 0;
        *(Type *)((long)&(p_Var3->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x40)
             = NOT_REPORTED;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x54) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x60) = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.incompleteText = PK;
      }
      else {
        bVar5 = std::operator==(group,"WND");
        if (!bVar5) goto LAB_0018e172;
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload = 10;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType =
             NOT_REPORTED;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x10) = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit = KNOTS;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x1c) = 0;
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) = 0;
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                          super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2d) =
             (ulong)(uint3)result.super__Optional_base<metaf::WindGroup,_true,_true>._M_payload.
                           super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
                           windType._0_3_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
                 vsecBegin.dirDegrees + 1) = 0;
        p_Var3 = &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                  _M_payload;
        *(uint *)((long)&(p_Var3->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x3c)
             = 0;
        *(Type *)((long)&(p_Var3->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x40)
             = NOT_REPORTED;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x54) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x60) = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.incompleteText = WND;
      }
      goto LAB_0018defc;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload = 6;
LAB_0018dec3:
    (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType =
         NOT_REPORTED;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x10) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit = KNOTS;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x1c) = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) = 0;
    *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                      _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2d) =
         (ulong)(uint3)result.super__Optional_base<metaf::WindGroup,_true,_true>._M_payload.
                       super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windType.
                       _0_3_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecBegin.
             dirDegrees + 1) = 0;
    p_Var3 = &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
              _M_payload;
    *(uint *)((long)&(p_Var3->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x3c) = 0
    ;
    *(Type *)((long)&(p_Var3->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x40) =
         NOT_REPORTED;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x54) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x60) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.incompleteText = NONE;
LAB_0018defc:
    (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_engaged = true;
    return __return_storage_ptr__;
  }
  if (reportPart == TAF) {
    bVar5 = std::operator==(group,"WSCONDS");
    if (bVar5) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload = 9;
      goto LAB_0018dec3;
    }
  }
  else {
    if (reportPart != METAR) goto LAB_0018e172;
    bVar5 = std::operator==(group,"WS");
    if (bVar5) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload = 5;
      (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType =
           NOT_REPORTED;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x10) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit = KNOTS;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x1c) = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) = 0;
      *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)
                        ._M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2d
                ) = (ulong)(uint3)result.super__Optional_base<metaf::WindGroup,_true,_true>.
                                  _M_payload.super__Optional_payload_base<metaf::WindGroup>.
                                  _M_payload._M_value.windType._0_3_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
               vsecBegin.dirDegrees + 1) = 0;
      p_Var3 = &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                _M_payload;
      *(uint *)((long)&(p_Var3->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x3c) =
           0;
      *(Type *)((long)&(p_Var3->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x40) =
           NOT_REPORTED;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x54) = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x60) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.incompleteText = WS;
      goto LAB_0018defc;
    }
  }
  parseVariableSector(&result,group);
  if (result.super__Optional_base<metaf::WindGroup,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_engaged == true) {
    poVar12 = &result;
    poVar13 = __return_storage_ptr__;
    for (lVar11 = 0x1a; lVar11 != 0; lVar11 = lVar11 + -1) {
      (poVar13->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windType =
           (poVar12->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windType;
      poVar12 = (optional<metaf::WindGroup> *)((long)poVar12 + (ulong)bVar17 * -8 + 4);
      poVar13 = (optional<metaf::WindGroup> *)((long)poVar13 + (ulong)bVar17 * -8 + 4);
    }
    goto LAB_0018defc;
  }
  if ((parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
       windRgx_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                                   ::windRgx_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
                windRgx_abi_cxx11_,
               "(?:WS(\\d\\d\\d)/)?(\\d\\d0|VRB|///)([1-9]?\\d\\d|//)(?:G([1-9]?\\d\\d))?([KM][TMP][HS]?)"
               ,0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                  ::windRgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                         ::windRgx_abi_cxx11_);
  }
  result.super__Optional_base<metaf::WindGroup,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::WindGroup>._M_payload._19_4_ = 0;
  result.super__Optional_base<metaf::WindGroup,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit._3_1_ = 0;
  result.super__Optional_base<metaf::WindGroup,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedValue.
  super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (optional<unsigned_int>)(_Optional_base<unsigned_int,_true,_true>)0x0;
  result.super__Optional_base<metaf::WindGroup,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windType._0_3_ = 0;
  result.super__Optional_base<metaf::WindGroup,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::WindGroup>._M_payload._3_5_ = 0;
  result.super__Optional_base<metaf::WindGroup,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType._0_3_ = 0;
  result.super__Optional_base<metaf::WindGroup,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::WindGroup>._M_payload._11_4_ = 0;
  result.super__Optional_base<metaf::WindGroup,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::WindGroup>._M_payload._15_4_ = 0;
  bVar5 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (group,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)&result,
                     &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                      ::windRgx_abi_cxx11_,0);
  if (!bVar5) {
    std::
    _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&result);
LAB_0018e172:
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.rw.
             super__Optional_base<metaf::Runway,_true,_true>._M_payload + 4) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 100) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x50) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.rw.
    super__Optional_base<metaf::Runway,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::Runway>._M_payload = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecEnd.dirType = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x48) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x30) = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecBegin.dirType = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x28) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedValue.
             super__Optional_base<unsigned_int,_true,_true> + 4) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedValue.
    super__Optional_base<unsigned_int,_true,_true>._M_payload =
         (_Optional_payload<unsigned_int,_true,_true,_true>)0x0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType = 0;
    return __return_storage_ptr__;
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&sStack_118,
        (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         *)&result,5);
  oVar7 = Speed::unitFromString(&sStack_118);
  std::__cxx11::string::~string((string *)&sStack_118);
  if (((ulong)oVar7.super__Optional_base<metaf::Speed::Unit,_true,_true>._M_payload.
              super__Optional_payload_base<metaf::Speed::Unit> >> 0x20 & 1) != 0) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&sStack_118,
          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)&result,3);
    oVar21 = Speed::fromString(&sStack_118,
                               oVar7.super__Optional_base<metaf::Speed::Unit,_true,_true>._M_payload
                               .super__Optional_payload_base<metaf::Speed::Unit>._M_payload);
    std::__cxx11::string::~string((string *)&sStack_118);
    if (((undefined1  [16])
         oVar21.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Speed> & (undefined1  [16])0x100000000) !=
        (undefined1  [16])0x0) {
      local_f0 = local_f0 & 0xffffff;
      uStack_ec = 0;
      uStack_e8 = 0;
      uStack_e5 = 0;
      uStack_e1 = 0;
      TStack_dd = NOT_REPORTED;
      dVar8 = std::__cxx11::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::length((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&result,1);
      if ((dVar8 == 0) &&
         (dVar8 = std::__cxx11::
                  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::length((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)&result,4), dVar8 == 0)) {
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&sStack_118,
              (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)&result,2);
        bVar5 = std::operator==(&sStack_118,"000");
        if (!bVar5) {
          std::__cxx11::string::~string((string *)&sStack_118);
          goto LAB_0018e1ad;
        }
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str((string_type *)&wsHeight,
              (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)&result,3);
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&wsHeight,"00");
        std::__cxx11::string::~string((string *)&wsHeight);
        std::__cxx11::string::~string((string *)&sStack_118);
        if (!bVar5) goto LAB_0018e1ad;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windType =
             SURFACE_WIND_CALM;
        p_Var3 = &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                  _M_payload;
        *(uint *)((long)&(p_Var3->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 4) =
             0;
        *(Type *)((long)&(p_Var3->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 8) =
             NOT_REPORTED;
        *(int *)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
                 wSpeed.speedValue.super__Optional_base<unsigned_int,_true,_true>._M_payload =
             oVar21.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Speed>._M_payload._0_4_;
        *(char *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>
                         )._M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload +
                 0x10) =
             oVar21.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Speed>._M_payload._4_1_;
        *(short *)((long)&(__return_storage_ptr__->
                          super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                          super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x11) =
             oVar21.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Speed>._M_payload._5_2_;
        *(char *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>
                         )._M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload +
                 0x13) =
             oVar21.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Speed>._M_payload._7_1_;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit =
             oVar21.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Speed>._M_payload._8_4_;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedValue.
        super__Optional_base<unsigned_int,_true,_true>._M_payload =
             (_Optional_payload<unsigned_int,_true,_true,_true>)0x0;
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                          super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2d) =
             CONCAT44(uStack_ec,local_f0);
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
                          vsecBegin.dirDegrees + 1) =
             CONCAT17((undefined1)uStack_e1,CONCAT43(uStack_e5,uStack_e8));
        DVar1.dirType = TStack_dd;
        DVar1.dirDegrees = uStack_e1;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecEnd = DVar1;
      }
      else {
LAB_0018e1ad:
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&sStack_118,
              (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)&result,2);
        oVar20 = Direction::fromDegreesString(&sStack_118);
        std::__cxx11::string::~string((string *)&sStack_118);
        if (((undefined1  [12])
             oVar20.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Direction> & (undefined1  [12])0x1) ==
            (undefined1  [12])0x0) goto LAB_0018e21d;
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&sStack_118,
              (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)&result,4);
        oVar22 = Speed::fromString(&sStack_118,
                                   oVar7.super__Optional_base<metaf::Speed::Unit,_true,_true>.
                                   _M_payload.super__Optional_payload_base<metaf::Speed::Unit>.
                                   _M_payload);
        UVar14 = oVar22.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
                 super__Optional_payload_base<metaf::Speed>._M_payload._8_4_;
        uVar9 = oVar22.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
                super__Optional_payload_base<metaf::Speed>._M_payload._0_8_;
        local_f8 = oVar21.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
                   super__Optional_payload_base<metaf::Speed>._M_payload._0_8_;
        std::__cxx11::string::~string((string *)&sStack_118);
        if (((undefined1  [16])
             oVar22.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Speed> & (undefined1  [16])0x100000000) ==
            (undefined1  [16])0x0) {
          uVar9 = 0;
          UVar14 = KNOTS;
          uVar16 = 0;
          uVar15 = 0;
        }
        else {
          uVar15 = uVar9 & 0xffffff0000000000;
          uVar16 = uVar9 & 0xff00000000;
          uVar9 = uVar9 & 0xffffffff;
        }
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&sStack_118,
              (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)&result,1);
        Distance::fromHeightString(&wsHeight,&sStack_118);
        uVar4 = local_f8;
        std::__cxx11::string::~string((string *)&sStack_118);
        if (wsHeight.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
            super__Optional_payload_base<metaf::Distance>._M_engaged == true) {
          uVar18 = (undefined4)
                   wsHeight.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
                   super__Optional_payload_base<metaf::Distance>._M_payload._0_8_;
          uVar19 = (undefined4)
                   ((ulong)wsHeight.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
                           super__Optional_payload_base<metaf::Distance>._M_payload._0_8_ >> 0x20);
          local_f0 = wsHeight.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
                     super__Optional_payload_base<metaf::Distance>._M_payload._9_4_;
          uStack_ec = CONCAT13(uStack_ec._3_1_,
                               wsHeight.super__Optional_base<metaf::Distance,_true,_true>._M_payload
                               .super__Optional_payload_base<metaf::Distance>._M_payload._M_value.
                               distUnit._1_3_);
          TVar10 = WIND_SHEAR;
        }
        else {
          uVar18 = 0;
          uVar19 = 0;
          wsHeight.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
          super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged = (bool)0;
          TVar10 = SURFACE_WIND;
        }
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windType = TVar10;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir =
             (Direction)
             oVar20.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Direction>._M_payload;
        *(int *)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
                 wSpeed.speedValue.super__Optional_base<unsigned_int,_true,_true>._M_payload =
             (int)local_f8;
        *(char *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>
                         )._M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload +
                 0x10) = (char)((ulong)uVar4 >> 0x20);
        *(short *)((long)&(__return_storage_ptr__->
                          super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                          super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x11) =
             (short)((ulong)uVar4 >> 0x28);
        *(char *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>
                         )._M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload +
                 0x13) = (char)((ulong)uVar4 >> 0x38);
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit =
             oVar21.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Speed>._M_payload._8_4_;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedValue.
        super__Optional_base<unsigned_int,_true,_true>._M_payload =
             (_Optional_payload<unsigned_int,_true,_true,_true>)(uVar16 | uVar9 | uVar15);
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = UVar14
        ;
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                          super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x24) =
             CONCAT44(uVar19,uVar18);
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) =
             wsHeight.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
             super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_engaged;
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                          super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2d) =
             CONCAT44(uStack_ec,local_f0);
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
                          vsecBegin.dirDegrees + 1) =
             CONCAT17((undefined1)uStack_e1,CONCAT43(uStack_e5,uStack_e8));
        DVar2.dirType = TStack_dd;
        DVar2.dirDegrees = uStack_e1;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecEnd = DVar2;
      }
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x54) = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x60) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.incompleteText = NONE;
      (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_engaged = true;
      goto LAB_0018e23b;
    }
  }
LAB_0018e21d:
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.rw.
           super__Optional_base<metaf::Runway,_true,_true>._M_payload + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 100) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x50) = 0;
  (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.rw.
  super__Optional_base<metaf::Runway,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Runway>._M_payload = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecEnd.dirType = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x48) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x30) = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecBegin.dirType = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x28) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedValue.
           super__Optional_base<unsigned_int,_true,_true> + 4) = 0;
  (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedValue.
  super__Optional_base<unsigned_int,_true,_true>._M_payload =
       (_Optional_payload<unsigned_int,_true,_true,_true>)0x0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType = 0;
LAB_0018e23b:
  std::
  _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::optional<WindGroup> WindGroup::parse(const std::string & group,
		ReportPart reportPart,
		const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	static const std::optional<WindGroup> notRecognised;

	if (reportPart == ReportPart::METAR) {
		if (group == "WS") return WindGroup(Type::WIND_SHEAR_IN_LOWER_LAYERS, IncompleteText::WS);
	}
	if (reportPart == ReportPart::TAF) {
		if (group == "WSCONDS") return WindGroup(Type::WSCONDS);
	}
	if (reportPart == ReportPart::RMK) {
		if (group == "WSHFT") return WindGroup(Type::WIND_SHIFT);
		if (group == "PK") return WindGroup(Type::PEAK_WIND, IncompleteText::PK);
		if (group == "WND") return WindGroup(Type::WND_MISG, IncompleteText::WND);
	}

	if (reportPart != ReportPart::METAR &&
		reportPart != ReportPart::TAF) return notRecognised;

	if (const auto result = parseVariableSector(group); result.has_value())
		return *result;

	static const std::regex windRgx("(?:WS(\\d\\d\\d)/)?"
		"(\\d\\d0|VRB|///)([1-9]?\\d\\d|//)(?:G([1-9]?\\d\\d))?([KM][TMP][HS]?)");
	static const auto matchWindShearHeight = 1, matchWindDir = 2;
	static const auto matchWindSpeed = 3, matchWindGust = 4, matchWindUnit = 5;

	// Surface wind or wind shear, e.g. dd0ssKT or dd0ssGggMPS or WShhhdd0ssGggKT
	if (std::smatch match; std::regex_match(group, match, windRgx)) {
		const auto speedUnit = Speed::unitFromString(match.str(matchWindUnit));
		if (!speedUnit.has_value()) return notRecognised;
		const auto speed = Speed::fromString(match.str(matchWindSpeed), *speedUnit);
		if (!speed.has_value()) return notRecognised;

		WindGroup result;

		if (!match.length(matchWindShearHeight) && 
			!match.length(matchWindGust) &&
			match.str(matchWindDir) == "000" &&
			match.str(matchWindSpeed) == "00")
		{
			//00000KT or 00000MPS or 00000KMH: calm wind
			result.windType = Type::SURFACE_WIND_CALM;
			result.wSpeed = *speed;
			return result;
		}

		const auto dir = Direction::fromDegreesString(match.str(matchWindDir));
		if (!dir.has_value()) return notRecognised;
		result.windDir = *dir;
		result.wSpeed = *speed;
		const auto gust = Speed::fromString(match.str(matchWindGust), *speedUnit);
		if (gust.has_value()) result.gSpeed = *gust;
		const auto wsHeight = Distance::fromHeightString(match.str(matchWindShearHeight));
		result.windType = Type::SURFACE_WIND;
		if (wsHeight.has_value()) {
			result.windType = Type::WIND_SHEAR;
			result.wShHeight = *wsHeight;
		}
		return result;
	}

	return notRecognised;
}